

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::rayleigh_dist<float>::cdf(rayleigh_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  result_type_conflict1 rVar2;
  
  rVar2 = 0.0;
  if (0.0 < x) {
    fVar1 = (this->P).nu_;
    fVar1 = expf((-x * x) / ((fVar1 + fVar1) * fVar1));
    rVar2 = 1.0 - fVar1;
  }
  return rVar2;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return 1 - math::exp(-x * x / (2 * P.nu() * P.nu()));
    }